

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Vector<unsigned_int,_2> __thiscall
gl4cts::Math::convertBvecToUvec<2>(Math *this,Vector<bool,_2> *src)

{
  bool *pbVar1;
  uint *puVar2;
  undefined4 local_1c;
  GLint i;
  Vector<bool,_2> *src_local;
  Vector<unsigned_int,_2> *result;
  
  tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)this);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    pbVar1 = tcu::Vector<bool,_2>::operator[](src,local_1c);
    if ((*pbVar1 & 1U) == 0) {
      puVar2 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,local_1c);
      *puVar2 = 0;
    }
    else {
      puVar2 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,local_1c);
      *puVar2 = 1;
    }
  }
  return (Vector<unsigned_int,_2>)(uint  [2])this;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> convertBvecToUvec(const tcu::Vector<bool, Size>& src)
{
	tcu::Vector<glw::GLuint, Size> result;

	for (glw::GLint i = 0; i < Size; ++i)
	{
		if (GL_FALSE != src[i])
		{
			result[i] = 1;
		}
		else
		{
			result[i] = 0;
		}
	}

	return result;
}